

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall Kompositum::Printer::visit(Printer *this,Composite *composite)

{
  IDType IVar1;
  pointer puVar2;
  Component *pCVar3;
  uint uVar4;
  unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *child;
  pointer puVar5;
  
  if (this->indent == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
    do {
      printf("+--");
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->indent);
    uVar4 = this->indent + 1;
  }
  this->indent = uVar4;
  IVar1 = (composite->super_Component).uid;
  if ((composite->children).
      super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (composite->children).
      super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    printf("- Composite (%lu): empty\n",IVar1);
  }
  else {
    printf("+ Composite (%lu):\n",IVar1);
    puVar2 = (composite->children).
             super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (composite->children).
                  super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1)
    {
      pCVar3 = (puVar5->_M_t).
               super___uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_>
               ._M_t.
               super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
               .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl;
      (*pCVar3->_vptr_Component[2])(pCVar3,this);
    }
  }
  this->indent = this->indent - 1;
  return;
}

Assistant:

void visit(Composite* composite) override {
        doIndentation();
        indent++;

        if (!composite->hasChildren()) {
            printf("- Composite (%lu): empty\n", composite->getID());
        } else {
            printf("+ Composite (%lu):\n", composite->getID());
            composite->visitChildren(*this);
        }

        indent--;
    }